

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-opts.cpp
# Opt level: O1

SlicerOptions *
parseSlicerOptions(SlicerOptions *__return_storage_ptr__,int argc,char **argv,bool requireCrit,
                  bool inputFileRequired)

{
  SmallVectorStorage<llvm::cl::OptionEnumValue,_4U> *pSVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  raw_ostream *this;
  undefined7 in_register_00000009;
  char *pcVar5;
  undefined7 in_register_00000081;
  undefined4 uVar6;
  string *opt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  opt<bool,_false,_llvm::cl::parser<bool>_> criteriaAreNextInstr;
  opt<bool,_false,_llvm::cl::parser<bool>_> cutoffDiverging;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allocationFuns;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFile;
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
  ddaType;
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
  ptaType;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryFunction;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacySlicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  slicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preservedFuns;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacySecondarySlicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputFile;
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  cdAlgorithm;
  alias cdaInterprocAlias;
  alias cdAlgAlias;
  opt<bool,_false,_llvm::cl::parser<bool>_> threads;
  opt<bool,_false,_llvm::cl::parser<bool>_> interprocCd;
  opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
  undefinedFunsBehavior;
  opt<bool,_false,_llvm::cl::parser<bool>_> preserveDbg;
  opt<bool,_false,_llvm::cl::parser<bool>_> forwardSlicing;
  opt<bool,_false,_llvm::cl::parser<bool>_> icfgCD;
  opt<bool,_false,_llvm::cl::parser<bool>_> cdaPerInstr;
  opt<bool,_false,_llvm::cl::parser<bool>_> removeSlicingCriteria;
  opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_> ptaFieldSensitivity;
  undefined1 local_1a51 [17];
  cat local_1a40;
  string *local_1a38;
  long **local_1a30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a28;
  OptionCategory local_1a08;
  desc local_19e8 [8];
  bool local_1968;
  undefined1 local_1948 [16];
  code *local_1938;
  ValuesClass local_1928;
  code *local_1878;
  OptionCategory local_1868 [4];
  string local_17e8;
  undefined **local_17c8;
  long *local_17c0;
  long local_17b0 [4];
  undefined1 local_1790 [16];
  code *local_1780;
  code *local_1770;
  ushort local_1766;
  long *local_16f0;
  long local_16e0 [2];
  undefined **local_16d0;
  long *local_16c8;
  long local_16b8 [4];
  undefined1 local_1698 [16];
  code *local_1688;
  undefined1 local_1678 [24];
  char *local_1660;
  size_t local_1658;
  OptionEnumValue local_1650 [2];
  AnalysisType local_15f8;
  undefined **local_15e0;
  undefined1 *local_15d0;
  undefined1 local_15c0 [384];
  undefined1 local_1440 [16];
  code *local_1430;
  undefined1 local_1420 [32];
  size_t local_1400;
  char *local_13f8;
  char local_13f0 [16];
  char *local_13e0;
  char local_13d8 [8];
  char *local_13d0;
  char local_13c8 [16];
  char *local_13b8;
  char local_13b0 [8];
  OptionEnumValue local_13a8;
  undefined1 *local_1378;
  undefined1 local_1368 [384];
  undefined1 local_11e8 [16];
  code *local_11d8;
  cat local_11c8 [16];
  long *local_1148 [2];
  long local_1138 [2];
  undefined **local_1128;
  long *local_1120;
  long local_1110 [4];
  undefined1 local_10f0 [16];
  code *local_10e0;
  code *local_10d0;
  ushort local_10c8;
  long *local_1050;
  long local_1040 [2];
  undefined **local_1030;
  long *local_1028;
  long local_1018 [4];
  undefined1 local_ff8 [16];
  code *local_fe8;
  code *local_fd8;
  ushort local_fd0;
  long *local_f58;
  long local_f48 [2];
  undefined **local_f38;
  long *local_f30;
  long local_f20 [4];
  undefined1 local_f00 [16];
  code *local_ef0;
  code *local_ee0 [16];
  string local_e60;
  undefined **local_e40;
  long *local_e38;
  long local_e28 [4];
  undefined1 local_e08 [16];
  code *local_df8;
  code *local_de8 [16];
  long *local_d68;
  long local_d58 [2];
  undefined **local_d48;
  long *local_d40;
  long local_d30 [4];
  undefined1 local_d10 [16];
  code *local_d00;
  code *local_cf0 [16];
  long *local_c70;
  long local_c60 [2];
  undefined **local_c50;
  long *local_c48;
  long local_c38 [4];
  undefined1 local_c18 [16];
  code *local_c08;
  undefined1 local_bf8 [24];
  char *local_be0;
  size_t local_bd8;
  char *local_bd0;
  char local_bc8 [16];
  char *local_bb8;
  char local_bb0 [8];
  char *local_ba8;
  char local_ba0 [16];
  char *local_b90;
  char local_b88 [8];
  char *local_b80;
  CDAlgorithm local_b78 [2];
  char local_b70 [8];
  char *local_b68;
  undefined **local_b60;
  char *local_b58;
  char **local_b50;
  undefined4 local_b48;
  char *local_b40;
  undefined8 local_b38;
  char *local_b30;
  undefined8 local_b28;
  undefined4 local_b20;
  char *local_b18;
  undefined8 local_b10;
  char *local_b08;
  undefined8 local_b00;
  undefined4 local_af8;
  char *local_af0;
  undefined8 local_ae8;
  char *local_ae0;
  undefined8 local_ad8;
  undefined4 local_ad0;
  char *local_ac8;
  undefined8 local_ac0;
  char *local_ab8;
  undefined8 local_ab0;
  undefined4 local_aa8;
  char *local_aa0;
  undefined8 local_a98;
  char *local_a90;
  undefined8 local_a88;
  undefined4 local_a80;
  char *local_a78;
  undefined8 local_a70;
  char *local_a68;
  undefined8 local_a60;
  undefined4 local_a58;
  char *local_a50;
  undefined8 local_a48;
  char *local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  char *local_a28;
  undefined8 local_a20;
  OptionEnumValue local_a18 [2];
  undefined1 local_9c0 [16];
  code *local_9b0;
  OptionCategory local_9a0 [4];
  cat local_918 [17];
  code *local_890 [16];
  bool local_810;
  undefined1 local_7f0 [16];
  code *local_7e0;
  OptionCategory local_7d0 [4];
  bool local_750;
  undefined1 local_730 [16];
  code *local_720;
  OptionEnumValue local_710;
  char *local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  char *local_6d0;
  undefined8 local_6c8;
  char *local_6c0;
  undefined8 local_6b8;
  undefined4 local_6b0;
  char *local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined8 local_690;
  undefined4 local_688;
  char *local_680;
  undefined **local_678;
  char *local_670;
  char **local_668;
  undefined4 local_660;
  char *local_658;
  undefined8 local_650;
  char *local_648;
  undefined8 local_640;
  undefined4 local_638;
  char *local_630;
  undefined8 local_628;
  char *local_620;
  undefined8 local_618;
  undefined4 local_610;
  char *local_608;
  undefined8 local_600;
  OptionEnumValue local_5f8 [7];
  undefined1 local_4d8 [16];
  code *local_4c8;
  code *local_4b8 [16];
  bool local_438;
  undefined1 local_418 [16];
  code *local_408;
  code *local_3f8 [16];
  bool local_378;
  undefined1 local_358 [16];
  code *local_348;
  code *local_338 [16];
  undefined1 local_2b8;
  undefined1 local_298 [16];
  code *local_288;
  code *local_278 [16];
  undefined1 local_1f8;
  undefined1 local_1d8 [16];
  code *local_1c8;
  code *local_1b8 [16];
  bool local_138;
  undefined1 local_118 [16];
  code *local_108;
  undefined **local_f8 [16];
  type local_78;
  undefined1 local_50 [16];
  code *local_40;
  
  local_1a38 = (string *)
               CONCAT44(local_1a38._4_4_,(int)CONCAT71(in_register_00000081,inputFileRequired));
  local_1a51._9_4_ = (int)CONCAT71(in_register_00000009,requireCrit);
  local_1a30 = (long **)CONCAT44(local_1a30._4_4_,argc);
  local_710.Name.Data =
       "Save the output to given file. If not specified,\na .sliced suffix is used with the original module name."
  ;
  local_710.Name.Length = 0x68;
  local_1420._0_8_ = "filename";
  local_1420._8_8_ = 8;
  local_1678._0_8_ = "";
  local_bf8._0_8_ = &SlicingOpts;
  local_1a51._1_8_ = argv;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[2],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_cf0,
             (char (*) [2])0x12c44e,(desc *)&local_710,(value_desc *)local_1420,
             (initializer<char[1]> *)local_1678,(cat *)local_bf8);
  local_bf8._0_4_ = 1;
  local_710.Name.Data = "<input file>";
  local_710.Name.Length = 0xc;
  local_1420._0_8_ = "";
  local_1678._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<llvm::cl::FormattingFlags,llvm::cl::desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)&local_1770,
             (FormattingFlags *)local_bf8,(desc *)&local_710,(initializer<char[1]> *)local_1420,
             (cat *)local_1678);
  if (local_1a38._0_4_ != 0) {
    local_1766 = local_1766 & 0xfff8 | 2;
  }
  local_710.Name.Data =
       "Slicing criterion\nS ::= file1,file2#line1,line2#[var1,fun1],[var2,fun2]\nS[&S];S[&S]\n";
  local_710.Name.Length = 0x54;
  local_1420._0_8_ = "crit";
  local_1420._8_8_ = 4;
  local_1678._0_8_ = "";
  local_bf8._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[3],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)&local_fd8,
             (char (*) [3])"sc",(desc *)&local_710,(value_desc *)local_1420,
             (initializer<char[1]> *)local_1678,(cat *)local_bf8);
  local_710.Name.Data =
       "Slice with respect to the call-sites of a given function\ni. e.: \'-c foo\' or \'-c __assert_fail\'. Special value is a \'ret\'\nin which case the slice is taken with respect to the return value\nof the main function. Further, you can specify the criterion as\nl:v where l is the line in the original code and v is the variable.\nl must be empty when v is a global variable. For local variables,\nthe variable v must be used on the line l.\nYou can use comma-separated list of more slicing criteria,\ne.g. -c foo,5:x,:glob\n"
  ;
  local_710.Name.Length = 0x1fd;
  local_1420._0_8_ = "crit";
  local_1420._8_8_ = 4;
  local_1678._0_8_ = "";
  local_bf8._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[2],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)&local_10d0,
             (char (*) [2])0x12b32c,(desc *)&local_710,(value_desc *)local_1420,
             (initializer<char[1]> *)local_1678,(cat *)local_bf8);
  local_710.Name.Data =
       "Set secondary slicing criterion. The criterion is a call\nto a given function. If just a name of the function is\ngiven, it is a \'control\' slicing criterion. If there is ()\nappended, it is \'data\' slicing criterion. E.g. foo means\ncontrol secondary slicing criterion, foo() means data\ndata secondary slicing criterion.\n"
  ;
  local_710.Name.Length = 0x13c;
  local_1420._0_8_ = "crit";
  local_1420._8_8_ = 4;
  local_1678._0_8_ = "";
  local_bf8._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[3],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_de8,
             (char (*) [3])"2c",(desc *)&local_710,(value_desc *)local_1420,
             (initializer<char[1]> *)local_1678,(cat *)local_bf8);
  local_710.Name.Data =
       "By default, slicer keeps also slicing criteria\nin the sliced program. This switch makes slicer to remove\nalso the criteria (i.e. behave like Weisser\'s algorithm)"
  ;
  local_710.Name.Length = 0xa1;
  local_bf8._0_8_ = local_bf8._0_8_ & 0xffffffffffffff00;
  local_1678._0_8_ = &SlicingOpts;
  local_1420._0_8_ = (cat *)local_bf8;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[24],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_1b8,
             (char (*) [24])"remove-slicing-criteria",(desc *)&local_710,
             (initializer<bool> *)local_1420,(cat *)local_1678);
  local_710.Name.Data =
       "Do not slice bodies of the given functions.\nThe argument is a comma-separated list of functions.\n"
  ;
  local_710.Name.Length = 0x61;
  local_1420._0_8_ = "funs";
  local_1420._8_8_ = 4;
  local_1678._0_8_ = "";
  local_bf8._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[20],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_ee0,
             (char (*) [20])"preserved-functions",(desc *)&local_710,(value_desc *)local_1420,
             (initializer<char[1]> *)local_1678,(cat *)local_bf8);
  local_710.Name.Data =
       "Compute interprocedural dependencies that cover, e.g.,\ncalls calls to exit() from inside of procedures. Default: true.\n"
  ;
  local_710.Name.Length = 0x77;
  local_bf8[0] = (opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
                  )0x1;
  local_1678._0_8_ = &SlicingOpts;
  local_1420._0_8_ = (cat *)local_bf8;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_7d0,(char (*) [13])0x12c058,
             (desc *)&local_710,(initializer<bool> *)local_1420,(cat *)local_1678);
  local_710.Name.Data =
       "Compute control dependencies per instruction (the default\nis per basic block)\n";
  local_710.Name.Length = 0x4e;
  local_bf8[0] = (opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
                  )0x0;
  local_1678._0_8_ = &SlicingOpts;
  local_1420._0_8_ = (cat *)local_bf8;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_278,(char (*) [13])"cda-per-inst",
             (desc *)&local_710,(initializer<bool> *)local_1420,(cat *)local_1678);
  local_710.Name.Data =
       "Compute control dependencies on interprocedural CFG.\nDefault: false (interprocedral CD are computed by\na separate analysis.\n"
  ;
  local_710.Name.Length = 0x7c;
  local_bf8._0_8_ = (ulong)(uint7)local_bf8._1_7_ << 8;
  local_1678._0_8_ = &SlicingOpts;
  local_1420._0_8_ = (cat *)local_bf8;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[9],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_338,(char (*) [9])"cda-icfg",
             (desc *)&local_710,(initializer<bool> *)local_1420,(cat *)local_1678);
  local_710.Name.Data =
       "Make PTA field sensitive/insensitive. The offset in a pointer\nis cropped to Offset::UNKNOWN when it is greater than N bytes.\nDefault is full field-sensitivity (N = Offset::UNKNOWN).\n"
  ;
  local_710.Name.Length = 0xb6;
  local_1420._0_8_ = "N";
  local_1420._8_8_ = 1;
  local_1678._0_8_ = &dg::Offset::UNKNOWN;
  local_bf8._0_8_ = &SlicingOpts;
  llvm::cl::opt<unsigned_long,false,llvm::cl::parser<unsigned_long>>::
  opt<char[20],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<unsigned_long>,llvm::cl::cat>
            ((opt<unsigned_long,false,llvm::cl::parser<unsigned_long>> *)local_f8,
             (char (*) [20])"pta-field-sensitive",(desc *)&local_710,(value_desc *)local_1420,
             (initializer<unsigned_long> *)local_1678,(cat *)local_bf8);
  local_1678._0_8_ = "Set the behavior of undefined functions\n";
  local_1678._8_8_ = 0x28;
  local_710.Name.Data = "pure";
  local_710.Name.Length = 4;
  local_710.Value = 0;
  local_710.Description.Data = "Assume that undefined functions do not read nor write memory";
  local_710.Description.Length = 0x3c;
  local_6e8 = "write-any";
  local_6e0 = 9;
  local_6d8 = 1;
  local_6d0 = "Assume that undefined functions may write any memory";
  local_6c8 = 0x34;
  local_6c0 = "read-any";
  local_6b8 = 8;
  local_6b0 = 2;
  local_6a8 = "Assume that undefined functions may read any memory";
  local_6a0 = 0x33;
  local_698 = "rw-any";
  local_690 = 6;
  local_688 = 3;
  local_680 = "Assume that undefined functions may read and write any memory";
  local_678 = (undefined **)0x3d;
  local_670 = "write-args";
  local_668 = (char **)0xa;
  local_660 = 4;
  local_658 = "Assume that undefined functions may write to arguments";
  local_650 = 0x36;
  local_648 = "read-args";
  local_640 = 9;
  local_638 = 8;
  local_630 = "Assume that undefined functions may read from arguments (default)";
  local_628 = 0x41;
  local_620 = "rw-args";
  local_618 = 7;
  local_610 = 0xc;
  local_608 = "Assume that undefined functions may read or write from/to arguments";
  local_600 = 0x43;
  local_1420._8_8_ = 0x400000000;
  local_1420._0_8_ = (char (*) [1])(local_1420 + 0x10);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::append<llvm::cl::OptionEnumValue_const*,void>
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)local_1420,&local_710,local_5f8);
  local_bf8._0_8_ = local_1868;
  local_1868[0].Name.Data = (char *)CONCAT44(local_1868[0].Name.Data._4_4_,8);
  local_11c8[0].Category = &SlicingOpts;
  llvm::cl::
  opt<dg::dda::UndefinedFunsBehavior,false,llvm::cl::parser<dg::dda::UndefinedFunsBehavior>>::
  opt<char[15],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::dda::UndefinedFunsBehavior>,llvm::cl::cat>
            ((opt<dg::dda::UndefinedFunsBehavior,false,llvm::cl::parser<dg::dda::UndefinedFunsBehavior>>
              *)&local_710,(char (*) [15])"undefined-funs",(desc *)local_1678,
             (ValuesClass *)local_1420,(initializer<dg::dda::UndefinedFunsBehavior> *)local_bf8,
             local_11c8);
  if ((char (*) [1])local_1420._0_8_ != (char (*) [1])(local_1420 + 0x10)) {
    free((void *)local_1420._0_8_);
  }
  local_1420._0_8_ = "Entry function of the program\n";
  local_1420._8_8_ = 0x1e;
  local_1678._0_8_ = "main";
  local_bf8._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[6],llvm::cl::desc,llvm::cl::initializer<char[5]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_11c8,
             (char (*) [6])"entry",(desc *)local_1420,(initializer<char[5]> *)local_1678,
             (cat *)local_bf8);
  local_1420._0_8_ = "Perform forward slicing\n";
  local_1420._8_8_ = 0x18;
  local_1868[0].Name.Data = (char *)((ulong)local_1868[0].Name.Data & 0xffffffffffffff00);
  local_bf8._0_8_ = &SlicingOpts;
  local_1678._0_8_ = local_1868;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[8],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_3f8,(char (*) [8])"forward",
             (desc *)local_1420,(initializer<bool> *)local_1678,(cat *)local_bf8);
  local_1420._0_8_ = "Consider threads are in input file (default=false).";
  local_1420._8_8_ = 0x33;
  local_1868[0].Name.Data = (char *)((ulong)local_1868[0].Name.Data & 0xffffffffffffff00);
  local_bf8._0_8_ = &SlicingOpts;
  local_1678._0_8_ = local_1868;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[17],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_890,(char (*) [17])"consider-threads",
             (desc *)local_1420,(initializer<bool> *)local_1678,(cat *)local_bf8);
  local_1420._0_8_ = "Preserve debugging information (default=true).";
  local_1420._8_8_ = 0x2e;
  local_1868[0].Name.Data = (char *)CONCAT71(local_1868[0].Name.Data._1_7_,1);
  local_bf8._0_8_ = &SlicingOpts;
  local_1678._0_8_ = local_1868;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_4b8,(char (*) [13])"preserve-dbg",
             (desc *)local_1420,(initializer<bool> *)local_1678,(cat *)local_bf8);
  local_1420._0_8_ =
       "Treat these functions as allocation functions\nThe argument is a comma-separated list of func:type,\nwhere func is the function and type is one of\nmalloc, calloc, or realloc.\nE.g., myAlloc:malloc will treat myAlloc as malloc.\n"
  ;
  local_1420._8_8_ = 0xe0;
  local_1678._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[16],llvm::cl::desc,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_1868,
             (char (*) [16])"allocation-funs",(desc *)local_1420,(cat *)local_1678);
  local_bf8._0_8_ = "Choose pointer analysis to use:";
  local_bf8._8_8_ = 0x1f;
  local_1420._0_8_ = "fi";
  local_1420._8_8_ = 2;
  local_1420._16_4_ = 0;
  local_1420._24_8_ = "Flow-insensitive PTA (default)";
  local_1400 = 0x1e;
  local_13f8 = "fs";
  local_13f0[0] = '\x02';
  local_13f0[1] = '\0';
  local_13f0[2] = '\0';
  local_13f0[3] = '\0';
  local_13f0[4] = '\0';
  local_13f0[5] = '\0';
  local_13f0[6] = '\0';
  local_13f0[7] = '\0';
  local_13f0[8] = '\x01';
  local_13f0[9] = '\0';
  local_13f0[10] = '\0';
  local_13f0[0xb] = '\0';
  local_13e0 = "Flow-sensitive PTA";
  local_13d8[0] = '\x12';
  local_13d8[1] = '\0';
  local_13d8[2] = '\0';
  local_13d8[3] = '\0';
  local_13d8[4] = '\0';
  local_13d8[5] = '\0';
  local_13d8[6] = '\0';
  local_13d8[7] = '\0';
  local_13d0 = "inv";
  local_13c8[0] = '\x03';
  local_13c8[1] = '\0';
  local_13c8[2] = '\0';
  local_13c8[3] = '\0';
  local_13c8[4] = '\0';
  local_13c8[5] = '\0';
  local_13c8[6] = '\0';
  local_13c8[7] = '\0';
  local_13c8[8] = '\x02';
  local_13c8[9] = '\0';
  local_13c8[10] = '\0';
  local_13c8[0xb] = '\0';
  local_13b8 = "PTA with invalidate nodes";
  local_13b0[0] = '\x19';
  local_13b0[1] = '\0';
  local_13b0[2] = '\0';
  local_13b0[3] = '\0';
  local_13b0[4] = '\0';
  local_13b0[5] = '\0';
  local_13b0[6] = '\0';
  local_13b0[7] = '\0';
  local_1678._8_8_ = 0x400000000;
  local_1678._0_8_ = (OptionCategory *)(local_1678 + 0x10);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::append<llvm::cl::OptionEnumValue_const*,void>
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)local_1678,(OptionEnumValue *)local_1420,
             &local_13a8);
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX = local_918;
  local_918[0].Category = (OptionCategory *)((ulong)local_918[0].Category._4_4_ << 0x20);
  local_19e8[0].Desc.Data = (char *)&SlicingOpts;
  llvm::cl::
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::LLVMPointerAnalysisOptions::AnalysisType>,llvm::cl::cat>
            ((opt<dg::LLVMPointerAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>>
              *)local_1420,(char (*) [4])"pta",(desc *)local_bf8,(ValuesClass *)local_1678,
             (initializer<dg::LLVMPointerAnalysisOptions::AnalysisType> *)&local_1928,
             (cat *)local_19e8);
  if ((OptionCategory *)local_1678._0_8_ != (OptionCategory *)(local_1678 + 0x10)) {
    free((void *)local_1678._0_8_);
  }
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX = "Choose data dependence analysis to use:";
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Size = 0x27;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Capacity = 0;
  local_1678._0_8_ = "ssa";
  local_1678._8_8_ = 3;
  local_1678._16_4_ = 0;
  local_1660 = "MemorySSA DDA (the only option right now)";
  local_1658 = 0x29;
  local_bf8._8_8_ = 0x400000000;
  local_bf8._0_8_ = (OptionCategory *)(local_bf8 + 0x10);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::append<llvm::cl::OptionEnumValue_const*,void>
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)local_bf8,(OptionEnumValue *)local_1678,
             local_1650);
  local_19e8[0].Desc.Data = (char *)local_9a0;
  local_9a0[0].Name.Data = (char *)((ulong)local_9a0[0].Name.Data._4_4_ << 0x20);
  local_918[0].Category = &SlicingOpts;
  llvm::cl::
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::DataDependenceAnalysisOptions::AnalysisType>,llvm::cl::cat>
            ((opt<dg::DataDependenceAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>>
              *)local_1678,(char (*) [4])"dda",(desc *)&local_1928,(ValuesClass *)local_bf8,
             (initializer<dg::DataDependenceAnalysisOptions::AnalysisType> *)local_19e8,local_918);
  if ((OptionCategory *)local_bf8._0_8_ != (OptionCategory *)(local_bf8 + 0x10)) {
    free((void *)local_bf8._0_8_);
  }
  local_19e8[0].Desc.Data = "Choose control dependencies algorithm:";
  local_19e8[0].Desc.Length = 0x26;
  local_bf8._0_8_ = "standard";
  local_bf8._8_8_ = 8;
  local_bf8._16_4_ = 0;
  local_be0 = "Ferrante\'s algorithm (default)";
  local_bd8 = 0x1e;
  local_bd0 = "classic";
  local_bc8[0] = '\a';
  local_bc8[1] = '\0';
  local_bc8[2] = '\0';
  local_bc8[3] = '\0';
  local_bc8[4] = '\0';
  local_bc8[5] = '\0';
  local_bc8[6] = '\0';
  local_bc8[7] = '\0';
  local_bc8[8] = '\0';
  local_bc8[9] = '\0';
  local_bc8[10] = '\0';
  local_bc8[0xb] = '\0';
  local_bb8 = "Alias to \"standard\"";
  local_bb0[0] = '\x13';
  local_bb0[1] = '\0';
  local_bb0[2] = '\0';
  local_bb0[3] = '\0';
  local_bb0[4] = '\0';
  local_bb0[5] = '\0';
  local_bb0[6] = '\0';
  local_bb0[7] = '\0';
  local_ba8 = "scd";
  local_ba0[0] = '\x03';
  local_ba0[1] = '\0';
  local_ba0[2] = '\0';
  local_ba0[3] = '\0';
  local_ba0[4] = '\0';
  local_ba0[5] = '\0';
  local_ba0[6] = '\0';
  local_ba0[7] = '\0';
  local_ba0[8] = '\0';
  local_ba0[9] = '\0';
  local_ba0[10] = '\0';
  local_ba0[0xb] = '\0';
  local_b90 = "Alias to \"standard\"";
  local_b88[0] = '\x13';
  local_b88[1] = '\0';
  local_b88[2] = '\0';
  local_b88[3] = '\0';
  local_b88[4] = '\0';
  local_b88[5] = '\0';
  local_b88[6] = '\0';
  local_b88[7] = '\0';
  local_b80 = "ntscd";
  local_b78 = (CDAlgorithm  [2])0x5;
  local_b70[0] = '\x05';
  local_b70[1] = '\0';
  local_b70[2] = '\0';
  local_b70[3] = '\0';
  local_b68 = "Non-termination sensitive control dependencies algorithm";
  local_b60 = (undefined **)0x38;
  local_b58 = "ntscd2";
  local_b50 = (char **)0x6;
  local_b48 = 2;
  local_b40 = 
  "Non-termination sensitive control dependencies algorithm (a different implementation)";
  local_b38 = 0x55;
  local_b30 = "ntscd-ranganath";
  local_b28 = 0xf;
  local_b20 = 3;
  local_b18 = 
  "Non-termination sensitive control dependencies algorithm (the fixed version of the original Ranganath et al.\'s algorithm)"
  ;
  local_b10 = 0x79;
  local_b08 = "ntscd-ranganath-orig";
  local_b00 = 0x14;
  local_af8 = 4;
  local_af0 = 
  "Non-termination sensitive control dependencies algorithm (the original (wrong) Ranganath et al.\'s algorithm)"
  ;
  local_ae8 = 0x6c;
  local_ae0 = "ntscd-legacy";
  local_ad8 = 0xc;
  local_ad0 = 1;
  local_ac8 = "Non-termination sensitive control dependencies algorithm (legacy implementation)";
  local_ac0 = 0x50;
  local_ab8 = "dod-ranganath";
  local_ab0 = 0xd;
  local_aa8 = 6;
  local_aa0 = 
  "Decisive order dependencies algorithm by Ranganath et al. - fixed version (standalone - for debugging)"
  ;
  local_a98 = 0x66;
  local_a90 = "dod";
  local_a88 = 3;
  local_a80 = 7;
  local_a78 = "Decisive order dependencies algorithm (standalone - for debugging)";
  local_a70 = 0x42;
  local_a68 = "dod+ntscd";
  local_a60 = 9;
  local_a58 = 8;
  local_a50 = "NTSCD and DOD together";
  local_a48 = 0x16;
  local_a40 = "scc";
  local_a38 = 3;
  local_a30 = 9;
  local_a28 = "Use strong control closure algorithm";
  local_a20 = 0x24;
  pSVar1 = &local_1928.Values.super_SmallVectorStorage<llvm::cl::OptionEnumValue,_4U>;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Size = 0;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Capacity = 4;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX = pSVar1;
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::append<llvm::cl::OptionEnumValue_const*,void>
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)&local_1928,(OptionEnumValue *)local_bf8,
             local_a18);
  local_918[0].Category = &local_1a08;
  local_1a08.Name.Data = (char *)((ulong)local_1a08.Name.Data._4_4_ << 0x20);
  local_9a0[0].Name.Data = (char *)&SlicingOpts;
  llvm::cl::
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::ControlDependenceAnalysisOptions::CDAlgorithm>,llvm::cl::cat>
            ((opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
              *)local_bf8,(char (*) [4])"cda",local_19e8,&local_1928,
             (initializer<dg::ControlDependenceAnalysisOptions::CDAlgorithm> *)local_918,
             (cat *)local_9a0);
  if ((SmallVectorStorage<llvm::cl::OptionEnumValue,_4U> *)
      local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
      super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
      super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
      super_SmallVectorBase<unsigned_int>.BeginX != pSVar1) {
    free(local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
         super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
         super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
         super_SmallVectorBase<unsigned_int>.BeginX);
  }
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX =
       "Choose control dependencies algorithm to use(this options is obsolete, it is alias to -cda):"
  ;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Size = 0x5c;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Capacity = 0;
  local_9a0[0].Name.Data = (char *)&SlicingOpts;
  local_19e8[0].Desc.Data = (char *)local_bf8;
  llvm::cl::alias::alias<char[7],llvm::cl::desc,llvm::cl::aliasopt,llvm::cl::cat>
            ((alias *)local_918,(char (*) [7])"cd-alg",(desc *)&local_1928,(aliasopt *)local_19e8,
             (cat *)local_9a0);
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX = "Alias to interproc-cd";
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Size = 0x15;
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.Capacity = 0;
  local_19e8[0].Desc.Data = (char *)local_7d0;
  local_1a08.Name.Data = (char *)&SlicingOpts;
  llvm::cl::alias::alias<char[14],llvm::cl::desc,llvm::cl::aliasopt,llvm::cl::cat>
            ((alias *)local_9a0,(char (*) [14])"cda-interproc",(desc *)&local_1928,
             (aliasopt *)local_19e8,(cat *)&local_1a08);
  local_19e8[0].Desc.Data =
       "Cutoff diverging paths. That is, call abort() on those paths that may not reach the slicing criterion (default=true)."
  ;
  local_19e8[0].Desc.Length = 0x75;
  local_1a08.Name.Data = local_1a51 + 0x11;
  local_1a40.Category._0_1_ = 1;
  local_1a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&SlicingOpts;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[17],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&local_1928,(char (*) [17])"cutoff-diverging"
             ,local_19e8,(initializer<bool> *)&local_1a08,(cat *)&local_1a28);
  local_1a08.Name.Data =
       "Assume that slicing criteria are not the call-sites\nof the given function, but the instructions that\nfollow the call. I.e. the call is used just to mark\nthe instruction.\nE.g. for \'crit\' being set as the criterion, slicing critera are all instructions that follow any call of \'crit\'.\n"
  ;
  local_1a08.Name.Length = 0x11b;
  local_1a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a51;
  local_1a51[0] = 0;
  local_1a40.Category = &SlicingOpts;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[24],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_19e8,
             (char (*) [24])"criteria-are-next-instr",(desc *)&local_1a08,
             (initializer<bool> *)&local_1a28,(cat *)(local_1a51 + 0x11));
  if (llvm::cl::TopLevelSubCommand == (SubCommand *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((_func_void_ptr *)&llvm::cl::TopLevelSubCommand,
               llvm::object_creator<llvm::cl::SubCommand>::call);
  }
  llvm::cl::HideUnrelatedOptions(&SlicingOpts,llvm::cl::TopLevelSubCommand);
  llvm::cl::ParseCommandLineOptions
            ((int)local_1a30,(char **)local_1a51._1_8_,(StringRef)ZEXT816(0x12b041),
             (raw_ostream *)0x0,(char *)0x0,false);
  if ((local_1a51[9] != '\0') && ((uint)local_10c8 + (uint)local_fd0 == 0)) {
    this = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<(this,"No slicing criteria specified (-sc or -c option)\n");
    exit(1);
  }
  (__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus
  ._M_p = (pointer)0x0;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction.
  _M_string_length = 0;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction.field_2.
  _M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction.
           field_2 + 8) = 0;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.maxIterations = 0;
  (__return_storage_ptr__->dgOptions).PTAOptions.analysisType = fi;
  (__return_storage_ptr__->dgOptions).PTAOptions.threads = false;
  *(undefined3 *)&(__return_storage_ptr__->dgOptions).PTAOptions.field_0x6d = 0;
  *(size_t *)
   ((long)&(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x28) = 0;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.preprocessGeps = false
  ;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.invalidateNodes =
       false;
  *(undefined6 *)
   &(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.field_0x3a = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x20) = (_Base_ptr)0x0;
  *(undefined8 *)
   &((_Rb_tree_header *)
    ((long)&(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
            super_AnalysisOptions.allocationFunctions._M_t._M_impl + 8))->_M_header = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
  fieldSensitivity.offset = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
    super_AnalysisOptions.allocationFunctions._M_t._M_impl = 0;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus
  ._M_p = (pointer)&(__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.
                    entryFunction.field_2;
  *(undefined4 *)
   &(__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction.field_2 =
       0x6e69616d;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction.
  _M_string_length = 4;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_LLVMAnalysisOptions.entryFunction.field_2.
  _M_local_buf[4] = '\0';
  dg::AnalysisOptions::AnalysisOptions
            (&(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
              super_AnalysisOptions);
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.preprocessGeps = true;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.invalidateNodes =
       false;
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.maxIterations = 0;
  (__return_storage_ptr__->dgOptions).PTAOptions.analysisType = fi;
  (__return_storage_ptr__->dgOptions).PTAOptions.threads = false;
  local_1a38 = (string *)&(__return_storage_ptr__->dgOptions).DDAOptions;
  dg::LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
            ((LLVMDataDependenceAnalysisOptions *)local_1a38);
  (__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus
  ._M_p = (pointer)0x0;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction.
  _M_string_length = 0;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction.field_2.
  _M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction.
           field_2 + 8) = 0;
  *(size_t *)
   ((long)&(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x28) = 0;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.algorithm =
       STANDARD;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
  interprocedural = false;
  *(undefined3 *)
   &(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.field_0x3d
       = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x20) = (_Base_ptr)0x0;
  *(undefined8 *)
   &((_Rb_tree_header *)
    ((long)&(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
            super_AnalysisOptions.allocationFunctions._M_t._M_impl + 8))->_M_header = 0;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
           super_AnalysisOptions.allocationFunctions._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
  super_AnalysisOptions.fieldSensitivity.offset = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
    super_AnalysisOptions.allocationFunctions._M_t._M_impl = 0;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus
  ._M_p = (pointer)&(__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.
                    entryFunction.field_2;
  *(undefined4 *)
   &(__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction.field_2 =
       0x6e69616d;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction.
  _M_string_length = 4;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_LLVMAnalysisOptions.entryFunction.field_2.
  _M_local_buf[4] = '\0';
  dg::AnalysisOptions::AnalysisOptions
            (&(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
              super_AnalysisOptions);
  *(undefined2 *)
   &(__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
    interprocedural = 1;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.field_0x3e =
       0;
  (__return_storage_ptr__->dgOptions).verifyGraph = true;
  (__return_storage_ptr__->dgOptions).threads = false;
  (__return_storage_ptr__->dgOptions).preserveDbg = true;
  local_1a51._9_8_ = &(__return_storage_ptr__->dgOptions).entryFunction;
  (__return_storage_ptr__->dgOptions).entryFunction._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->dgOptions).entryFunction.field_2;
  *(undefined4 *)&(__return_storage_ptr__->dgOptions).entryFunction.field_2 = 0x6e69616d;
  (__return_storage_ptr__->dgOptions).entryFunction._M_string_length = 4;
  (__return_storage_ptr__->dgOptions).entryFunction.field_2._M_local_buf[4] = '\0';
  (__return_storage_ptr__->additionalSlicingCriteria).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->additionalSlicingCriteria).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->additionalSlicingCriteria).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->preservedFunctions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->preservedFunctions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->preservedFunctions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->removeSlicingCriteria = false;
  __return_storage_ptr__->forwardSlicing = false;
  __return_storage_ptr__->cutoffDiverging = true;
  __return_storage_ptr__->criteriaAreNextInstr = false;
  (__return_storage_ptr__->slicingCriteria)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->slicingCriteria).field_2;
  (__return_storage_ptr__->slicingCriteria)._M_string_length = 0;
  (__return_storage_ptr__->slicingCriteria).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->legacySlicingCriteria)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->legacySlicingCriteria).field_2;
  (__return_storage_ptr__->legacySlicingCriteria)._M_string_length = 0;
  (__return_storage_ptr__->legacySlicingCriteria).field_2._M_local_buf[0] = '\0';
  local_1a51._1_8_ = &__return_storage_ptr__->legacySecondarySlicingCriteria;
  (__return_storage_ptr__->legacySecondarySlicingCriteria)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->legacySecondarySlicingCriteria).field_2;
  (__return_storage_ptr__->legacySecondarySlicingCriteria)._M_string_length = 0;
  (__return_storage_ptr__->legacySecondarySlicingCriteria).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->inputFile)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->inputFile).field_2;
  (__return_storage_ptr__->inputFile)._M_string_length = 0;
  (__return_storage_ptr__->inputFile).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->outputFile)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->outputFile).field_2;
  (__return_storage_ptr__->outputFile)._M_string_length = 0;
  (__return_storage_ptr__->outputFile).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->inputFile);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->outputFile);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->slicingCriteria);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->legacySlicingCriteria);
  std::__cxx11::string::_M_assign((string *)local_1a51._1_8_);
  splitList(&local_1a28,&local_e60,',');
  local_1a08.Name.Data =
       (char *)(__return_storage_ptr__->preservedFunctions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_1a08.Name.Length =
       (size_t)(__return_storage_ptr__->preservedFunctions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_1a08.Description.Data =
       (char *)(__return_storage_ptr__->preservedFunctions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->preservedFunctions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1a28.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->preservedFunctions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1a28.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->preservedFunctions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1a28.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a28);
  __return_storage_ptr__->removeSlicingCriteria = local_138;
  __return_storage_ptr__->forwardSlicing = local_378;
  __return_storage_ptr__->cutoffDiverging =
       (bool)local_1928.Values.super_SmallVectorStorage<llvm::cl::OptionEnumValue,_4U>.InlineElts
             [0x70];
  __return_storage_ptr__->criteriaAreNextInstr = local_1968;
  local_1a30 = local_1148;
  std::__cxx11::string::_M_assign((string *)local_1a51._9_8_);
  (__return_storage_ptr__->dgOptions).preserveDbg = local_438;
  (__return_storage_ptr__->dgOptions).threads = local_810;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.algorithm =
       local_b78[0];
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.
  interprocedural = local_750;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.field_0x3e =
       local_2b8;
  (__return_storage_ptr__->dgOptions).CDAOptions.super_ControlDependenceAnalysisOptions.field_0x3d =
       local_1f8;
  splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a08,&local_17e8,',');
  sVar2 = local_1a08.Name.Length;
  if (local_1a08.Name.Data != (char *)local_1a08.Name.Length) {
    local_1a51._9_8_ =
         &(__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.
          super_AnalysisOptions.allocationFunctions;
    local_1a51._1_8_ =
         &(__return_storage_ptr__->dgOptions).DDAOptions.super_DataDependenceAnalysisOptions.
          super_AnalysisOptions.allocationFunctions;
    opt = (string *)local_1a08.Name.Data;
    do {
      splitList(&local_1a28,opt,':');
      if ((long)local_1a28.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1a28.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x40) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)(local_1a28.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar3 == 0) {
          uVar6 = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)(local_1a28.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
          if (iVar3 == 0) {
            uVar6 = 2;
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)(local_1a28.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
            if (iVar3 != 0) {
              pcVar4 = (char *)llvm::errs();
              if ((ulong)(*(long *)(pcVar4 + 0x18) - (long)*(char **)(pcVar4 + 0x20)) < 0x2c) {
                pcVar5 = "ERROR: Invalid type of allocation function: ";
                goto LAB_0011aa79;
              }
              builtin_strncpy(*(char **)(pcVar4 + 0x20),
                              "ERROR: Invalid type of allocation function: ",0x2c);
              *(long *)(pcVar4 + 0x20) = *(long *)(pcVar4 + 0x20) + 0x2c;
              goto LAB_0011aaa1;
            }
            uVar6 = 4;
          }
        }
        local_1a40.Category._0_4_ = uVar6;
        std::
        _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dg::AllocationFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,dg::AllocationFunction&>
                  ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dg::AllocationFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>>
                    *)local_1a51._9_8_,
                   local_1a28.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (AllocationFunction *)(local_1a51 + 0x11));
        local_1a40.Category._0_4_ = uVar6;
        std::
        _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dg::AllocationFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,dg::AllocationFunction&>
                  ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dg::AllocationFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dg::AllocationFunction>>>
                    *)local_1a51._1_8_,
                   local_1a28.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (AllocationFunction *)(local_1a51 + 0x11));
      }
      else {
        pcVar4 = (char *)llvm::errs();
        if ((ulong)(*(long *)(pcVar4 + 0x18) - (long)*(char **)(pcVar4 + 0x20)) < 0x24) {
          pcVar5 = "ERROR: Invalid allocation function: ";
LAB_0011aa79:
          pcVar4 = (char *)llvm::raw_ostream::write(pcVar4,(ulong)pcVar5);
        }
        else {
          builtin_strncpy(*(char **)(pcVar4 + 0x20),"ERROR: Invalid allocation function: ",0x24);
          *(long *)(pcVar4 + 0x20) = *(long *)(pcVar4 + 0x20) + 0x24;
        }
LAB_0011aaa1:
        pcVar4 = (char *)llvm::raw_ostream::write(pcVar4,(ulong)(opt->_M_dataplus)._M_p);
        if (*(undefined1 **)(pcVar4 + 0x18) == *(undefined1 **)(pcVar4 + 0x20)) {
          llvm::raw_ostream::write(pcVar4,0x12c650);
        }
        else {
          **(undefined1 **)(pcVar4 + 0x20) = 10;
          *(long *)(pcVar4 + 0x20) = *(long *)(pcVar4 + 0x20) + 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a28);
      opt = opt + 1;
    } while (opt != (string *)sVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a08);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  (__return_storage_ptr__->dgOptions).PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
  fieldSensitivity.offset = local_78;
  (__return_storage_ptr__->dgOptions).PTAOptions.analysisType = (AnalysisType)local_13a8.Name.Length
  ;
  (__return_storage_ptr__->dgOptions).PTAOptions.threads = local_810;
  (__return_storage_ptr__->dgOptions).DDAOptions.threads = local_810;
  std::__cxx11::string::_M_assign(local_1a38);
  (__return_storage_ptr__->dgOptions).DDAOptions.super_DataDependenceAnalysisOptions.
  undefinedFunsBehavior = (UndefinedFunsBehavior)local_690;
  (__return_storage_ptr__->dgOptions).DDAOptions.super_DataDependenceAnalysisOptions.analysisType =
       local_15f8;
  local_19e8[0].Desc.Data = (char *)llvm::raw_ostream::operator<<;
  if (local_1938 != (code *)0x0) {
    (*local_1938)(local_1948,local_1948,3);
  }
  llvm::cl::Option::~Option((Option *)local_19e8);
  local_1928.Values.super_SmallVectorImpl<llvm::cl::OptionEnumValue>.
  super_SmallVectorTemplateBase<llvm::cl::OptionEnumValue,_true>.
  super_SmallVectorTemplateCommon<llvm::cl::OptionEnumValue,_void>.
  super_SmallVectorBase<unsigned_int>.BeginX = llvm::raw_ostream::operator<<;
  if (local_1878 != (code *)0x0) {
    pcVar4 = local_1928.Values.super_SmallVectorStorage<llvm::cl::OptionEnumValue,_4U>.InlineElts +
             0x90;
    (*local_1878)(pcVar4,pcVar4,3);
  }
  llvm::cl::Option::~Option((Option *)&local_1928);
  llvm::cl::Option::~Option((Option *)local_9a0);
  llvm::cl::Option::~Option((Option *)local_918);
  local_bf8._0_8_ = &PTR_handleOccurrence_00133640;
  if (local_9b0 != (code *)0x0) {
    (*local_9b0)(local_9c0,local_9c0,3);
  }
  local_b60 = &PTR__parser_001336a8;
  if (local_b50 != &local_b40) {
    free(local_b50);
  }
  llvm::cl::Option::~Option((Option *)local_bf8);
  local_1678._0_8_ = &PTR_handleOccurrence_00133738;
  if (local_1430 != (code *)0x0) {
    (*local_1430)(local_1440,local_1440,3);
  }
  local_15e0 = &PTR__parser_001337a0;
  if (local_15d0 != local_15c0) {
    free(local_15d0);
  }
  llvm::cl::Option::~Option((Option *)local_1678);
  local_1420._0_8_ = &PTR_handleOccurrence_00133830;
  if (local_11d8 != (code *)0x0) {
    (*local_11d8)(local_11e8,local_11e8,3);
  }
  local_13a8.Description.Length = (size_t)&PTR__parser_00133898;
  if (local_1378 != local_1368) {
    free(local_1378);
  }
  llvm::cl::Option::~Option((Option *)local_1420);
  local_1868[0].Name.Data = (char *)__cxa_finalize;
  if (local_1780 != (code *)0x0) {
    (*local_1780)(local_1790,local_1790,3);
  }
  local_17c8 = &PTR_compare_00133928;
  if (local_17c0 != local_17b0) {
    operator_delete(local_17c0,local_17b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17e8._M_dataplus._M_p != &local_17e8.field_2) {
    operator_delete(local_17e8._M_dataplus._M_p,local_17e8.field_2._M_allocated_capacity + 1);
  }
  llvm::cl::Option::~Option((Option *)local_1868);
  local_4b8[0] = llvm::raw_ostream::operator<<;
  if (local_408 != (code *)0x0) {
    (*local_408)(local_418,local_418,3);
  }
  llvm::cl::Option::~Option((Option *)local_4b8);
  local_890[0] = llvm::raw_ostream::operator<<;
  if (local_7e0 != (code *)0x0) {
    (*local_7e0)(local_7f0,local_7f0,3);
  }
  llvm::cl::Option::~Option((Option *)local_890);
  local_3f8[0] = llvm::raw_ostream::operator<<;
  if (local_348 != (code *)0x0) {
    (*local_348)(local_358,local_358,3);
  }
  llvm::cl::Option::~Option((Option *)local_3f8);
  local_11c8[0].Category = (OptionCategory *)__cxa_finalize;
  if (local_10e0 != (code *)0x0) {
    (*local_10e0)(local_10f0,local_10f0,3);
  }
  local_1128 = &PTR_compare_00133928;
  if (local_1120 != local_1110) {
    operator_delete(local_1120,local_1110[0] + 1);
  }
  if (local_1148[0] != local_1138) {
    operator_delete(local_1148[0],local_1138[0] + 1);
  }
  llvm::cl::Option::~Option((Option *)local_11c8);
  local_710.Name.Data = (char *)&PTR_handleOccurrence_00133948;
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(local_4d8,local_4d8,3);
  }
  local_678 = &PTR__parser_001339b0;
  if (local_668 != &local_658) {
    free(local_668);
  }
  llvm::cl::Option::~Option((Option *)&local_710);
  local_f8[0] = &PTR_handleOccurrence_00133a40;
  if (local_40 != (code *)0x0) {
    (*local_40)(local_50,local_50,3);
  }
  llvm::cl::Option::~Option((Option *)local_f8);
  local_338[0] = llvm::raw_ostream::operator<<;
  if (local_288 != (code *)0x0) {
    (*local_288)(local_298,local_298,3);
  }
  llvm::cl::Option::~Option((Option *)local_338);
  local_278[0] = llvm::raw_ostream::operator<<;
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(local_1d8,local_1d8,3);
  }
  llvm::cl::Option::~Option((Option *)local_278);
  local_7d0[0].Name.Data = (char *)llvm::raw_ostream::operator<<;
  if (local_720 != (code *)0x0) {
    (*local_720)(local_730,local_730,3);
  }
  llvm::cl::Option::~Option((Option *)local_7d0);
  local_ee0[0] = __cxa_finalize;
  if (local_df8 != (code *)0x0) {
    (*local_df8)(local_e08,local_e08,3);
  }
  local_e40 = &PTR_compare_00133928;
  if (local_e38 != local_e28) {
    operator_delete(local_e38,local_e28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._M_dataplus._M_p != &local_e60.field_2) {
    operator_delete(local_e60._M_dataplus._M_p,local_e60.field_2._M_allocated_capacity + 1);
  }
  llvm::cl::Option::~Option((Option *)local_ee0);
  local_1b8[0] = llvm::raw_ostream::operator<<;
  if (local_108 != (code *)0x0) {
    (*local_108)(local_118,local_118,3);
  }
  llvm::cl::Option::~Option((Option *)local_1b8);
  local_de8[0] = __cxa_finalize;
  if (local_d00 != (code *)0x0) {
    (*local_d00)(local_d10,local_d10,3);
  }
  local_d48 = &PTR_compare_00133928;
  if (local_d40 != local_d30) {
    operator_delete(local_d40,local_d30[0] + 1);
  }
  if (local_d68 != local_d58) {
    operator_delete(local_d68,local_d58[0] + 1);
  }
  llvm::cl::Option::~Option((Option *)local_de8);
  local_10d0 = __cxa_finalize;
  if (local_fe8 != (code *)0x0) {
    (*local_fe8)(local_ff8,local_ff8,3);
  }
  local_1030 = &PTR_compare_00133928;
  if (local_1028 != local_1018) {
    operator_delete(local_1028,local_1018[0] + 1);
  }
  if (local_1050 != local_1040) {
    operator_delete(local_1050,local_1040[0] + 1);
  }
  llvm::cl::Option::~Option((Option *)&local_10d0);
  local_fd8 = __cxa_finalize;
  if (local_ef0 != (code *)0x0) {
    (*local_ef0)(local_f00,local_f00,3);
  }
  local_f38 = &PTR_compare_00133928;
  if (local_f30 != local_f20) {
    operator_delete(local_f30,local_f20[0] + 1);
  }
  if (local_f58 != local_f48) {
    operator_delete(local_f58,local_f48[0] + 1);
  }
  llvm::cl::Option::~Option((Option *)&local_fd8);
  local_1770 = __cxa_finalize;
  if (local_1688 != (code *)0x0) {
    (*local_1688)(local_1698,local_1698,3);
  }
  local_16d0 = &PTR_compare_00133928;
  if (local_16c8 != local_16b8) {
    operator_delete(local_16c8,local_16b8[0] + 1);
  }
  if (local_16f0 != local_16e0) {
    operator_delete(local_16f0,local_16e0[0] + 1);
  }
  llvm::cl::Option::~Option((Option *)&local_1770);
  local_cf0[0] = __cxa_finalize;
  if (local_c08 != (code *)0x0) {
    (*local_c08)(local_c18,local_c18,3);
  }
  local_c50 = &PTR_compare_00133928;
  if (local_c48 != local_c38) {
    operator_delete(local_c48,local_c38[0] + 1);
  }
  if (local_c70 != local_c60) {
    operator_delete(local_c70,local_c60[0] + 1);
  }
  llvm::cl::Option::~Option((Option *)local_cf0);
  return __return_storage_ptr__;
}

Assistant:

SlicerOptions parseSlicerOptions(int argc, char *argv[], bool requireCrit,
                                 bool inputFileRequired) {
    llvm::cl::opt<std::string> outputFile(
            "o",
            llvm::cl::desc(
                    "Save the output to given file. If not specified,\n"
                    "a .sliced suffix is used with the original module name."),
            llvm::cl::value_desc("filename"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> inputFile(
            llvm::cl::Positional, llvm::cl::desc("<input file>"),
            llvm::cl::init(""), llvm::cl::cat(SlicingOpts));

    if (inputFileRequired) {
        inputFile.setNumOccurrencesFlag(llvm::cl::Required);
    }

    llvm::cl::opt<std::string> slicingCriteria(
            "sc",
            llvm::cl::desc(
                    "Slicing criterion\n"
                    "S ::= file1,file2#line1,line2#[var1,fun1],[var2,fun2]\n"
                    "S[&S];S[&S]\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> legacySlicingCriteria(
            "c",
            llvm::cl::desc(
                    "Slice with respect to the call-sites of a given function\n"
                    "i. e.: '-c foo' or '-c __assert_fail'. Special value is a "
                    "'ret'\n"
                    "in which case the slice is taken with respect to the "
                    "return value\n"
                    "of the main function. Further, you can specify the "
                    "criterion as\n"
                    "l:v where l is the line in the original code and v is the "
                    "variable.\n"
                    "l must be empty when v is a global variable. For local "
                    "variables,\n"
                    "the variable v must be used on the line l.\n"
                    "You can use comma-separated list of more slicing "
                    "criteria,\n"
                    "e.g. -c foo,5:x,:glob\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> legacySecondarySlicingCriteria(
            "2c",
            llvm::cl::desc(
                    "Set secondary slicing criterion. The criterion is a call\n"
                    "to a given function. If just a name of the function is\n"
                    "given, it is a 'control' slicing criterion. If there is "
                    "()\n"
                    "appended, it is 'data' slicing criterion. E.g. foo means\n"
                    "control secondary slicing criterion, foo() means data\n"
                    "data secondary slicing criterion.\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> removeSlicingCriteria(
            "remove-slicing-criteria",
            llvm::cl::desc(
                    "By default, slicer keeps also slicing criteria\n"
                    "in the sliced program. This switch makes slicer to "
                    "remove\n"
                    "also the criteria (i.e. behave like Weisser's algorithm)"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> preservedFuns(
            "preserved-functions",
            llvm::cl::desc(
                    "Do not slice bodies of the given functions.\n"
                    "The argument is a comma-separated list of functions.\n"),
            llvm::cl::value_desc("funs"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> interprocCd(
            "interproc-cd",
            llvm::cl::desc(
                    "Compute interprocedural dependencies that cover, e.g.,\n"
                    "calls calls to exit() from inside of procedures. Default: "
                    "true.\n"),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> cdaPerInstr(
            "cda-per-inst",
            llvm::cl::desc("Compute control dependencies per instruction (the "
                           "default\n"
                           "is per basic block)\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> icfgCD(
            "cda-icfg",
            llvm::cl::desc(
                    "Compute control dependencies on interprocedural CFG.\n"
                    "Default: false (interprocedral CD are computed by\n"
                    "a separate analysis.\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<uint64_t> ptaFieldSensitivity(
            "pta-field-sensitive",
            llvm::cl::desc("Make PTA field sensitive/insensitive. The offset "
                           "in a pointer\n"
                           "is cropped to Offset::UNKNOWN when it is greater "
                           "than N bytes.\n"
                           "Default is full field-sensitivity (N = "
                           "Offset::UNKNOWN).\n"),
            llvm::cl::value_desc("N"), llvm::cl::init(dg::Offset::UNKNOWN),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<dg::dda::UndefinedFunsBehavior> undefinedFunsBehavior(
            "undefined-funs",
            llvm::cl::desc("Set the behavior of undefined functions\n"),
            llvm::cl::values(
                    clEnumValN(dg::dda::PURE, "pure",
                               "Assume that undefined functions do not read "
                               "nor write memory"),
                    clEnumValN(dg::dda::WRITE_ANY, "write-any",
                               "Assume that undefined functions may write any "
                               "memory"),
                    clEnumValN(dg::dda::READ_ANY, "read-any",
                               "Assume that undefined functions may read any "
                               "memory"),
                    clEnumValN(dg::dda::READ_ANY | dg::dda::WRITE_ANY, "rw-any",
                               "Assume that undefined functions may read and "
                               "write any memory"),
                    clEnumValN(dg::dda::WRITE_ARGS, "write-args",
                               "Assume that undefined functions may write to "
                               "arguments"),
                    clEnumValN(dg::dda::READ_ARGS, "read-args",
                               "Assume that undefined functions may read from "
                               "arguments (default)"),
                    clEnumValN(dg::dda::WRITE_ARGS | dg::dda::READ_ARGS,
                               "rw-args",
                               "Assume that undefined functions may read or "
                               "write from/to arguments")
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(dg::dda::READ_ARGS), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> entryFunction(
            "entry", llvm::cl::desc("Entry function of the program\n"),
            llvm::cl::init("main"), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> forwardSlicing(
            "forward", llvm::cl::desc("Perform forward slicing\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> threads(
            "consider-threads",
            llvm::cl::desc(
                    "Consider threads are in input file (default=false)."),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> preserveDbg(
            "preserve-dbg",
            llvm::cl::desc("Preserve debugging information (default=true)."),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> allocationFuns(
            "allocation-funs",
            llvm::cl::desc(
                    "Treat these functions as allocation functions\n"
                    "The argument is a comma-separated list of func:type,\n"
                    "where func is the function and type is one of\n"
                    "malloc, calloc, or realloc.\n"
                    "E.g., myAlloc:malloc will treat myAlloc as malloc.\n"),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<LLVMPointerAnalysisOptions::AnalysisType> ptaType(
            "pta", llvm::cl::desc("Choose pointer analysis to use:"),
            llvm::cl::values(
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::fi,
                               "fi", "Flow-insensitive PTA (default)"),
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::fs,
                               "fs", "Flow-sensitive PTA"),
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::inv,
                               "inv", "PTA with invalidate nodes")
#ifdef HAVE_SVF
                            ,
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::svf,
                               "svf", "Use pointer analysis from SVF project")
#endif
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(LLVMPointerAnalysisOptions::AnalysisType::fi),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<LLVMDataDependenceAnalysisOptions::AnalysisType> ddaType(
            "dda", llvm::cl::desc("Choose data dependence analysis to use:"),
            llvm::cl::values(
                    clEnumValN(LLVMDataDependenceAnalysisOptions::AnalysisType::
                                       ssa,
                               "ssa",
                               "MemorySSA DDA (the only option right now)")
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(
                    LLVMDataDependenceAnalysisOptions::AnalysisType::ssa),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm>
            cdAlgorithm(
                    "cda",
                    llvm::cl::desc("Choose control dependencies algorithm:"),
                    llvm::cl::values(
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "standard",
                                       "Ferrante's algorithm (default)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "classic", "Alias to \"standard\""),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "scd", "Alias to \"standard\""),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD,
                                       "ntscd",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD2,
                                       "ntscd2",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (a different "
                                       "implementation)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD_RANGANATH,
                                       "ntscd-ranganath",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (the fixed "
                                       "version of the original Ranganath et "
                                       "al.'s algorithm)"),
                            clEnumValN(
                                    dg::ControlDependenceAnalysisOptions::
                                            CDAlgorithm::NTSCD_RANGANATH_ORIG,
                                    "ntscd-ranganath-orig",
                                    "Non-termination sensitive control "
                                    "dependencies algorithm (the original "
                                    "(wrong) Ranganath et al.'s algorithm)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD_LEGACY,
                                       "ntscd-legacy",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (legacy "
                                       "implementation)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DOD_RANGANATH,
                                       "dod-ranganath",
                                       "Decisive order dependencies algorithm "
                                       "by Ranganath et al. - fixed version "
                                       "(standalone - for debugging)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DOD,
                                       "dod",
                                       "Decisive order dependencies algorithm "
                                       "(standalone - for debugging)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DODNTSCD,
                                       "dod+ntscd", "NTSCD and DOD together"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STRONG_CC,
                                       "scc",
                                       "Use strong control closure algorithm")
#if LLVM_VERSION_MAJOR < 4
                                    ,
                            nullptr
#endif
                            ),
                    llvm::cl::init(dg::ControlDependenceAnalysisOptions::
                                           CDAlgorithm::STANDARD),
                    llvm::cl::cat(SlicingOpts));

    llvm::cl::alias cdAlgAlias(
            "cd-alg",
            llvm::cl::desc("Choose control dependencies algorithm to use"
                           "(this options is obsolete, it is alias to -cda):"),
            llvm::cl::aliasopt(cdAlgorithm), llvm::cl::cat(SlicingOpts));

    llvm::cl::alias cdaInterprocAlias(
            "cda-interproc", llvm::cl::desc("Alias to interproc-cd"),
            llvm::cl::aliasopt(interprocCd), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> cutoffDiverging(
            "cutoff-diverging",
            llvm::cl::desc("Cutoff diverging paths. That is, call abort() on "
                           "those paths that may not reach the slicing "
                           "criterion (default=true)."),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> criteriaAreNextInstr(
            "criteria-are-next-instr",
            llvm::cl::desc(
                    "Assume that slicing criteria are not the call-sites\n"
                    "of the given function, but the instructions that\n"
                    "follow the call. I.e. the call is used just to mark\n"
                    "the instruction.\n"
                    "E.g. for 'crit' being set as the criterion, slicing "
                    "critera are all instructions that follow any call of "
                    "'crit'.\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    ////////////////////////////////////
    // ===-- End of the options --=== //
    ////////////////////////////////////

    // hide all options except ours options
    // this method is available since LLVM 3.7
#if ((LLVM_VERSION_MAJOR > 3) ||                                               \
     ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR >= 7)))
    llvm::cl::HideUnrelatedOptions(SlicingOpts);
#endif
    llvm::cl::ParseCommandLineOptions(argc, argv);

    if (requireCrit) {
        if (slicingCriteria.getNumOccurrences() +
                    legacySlicingCriteria.getNumOccurrences() ==
            0) {
            llvm::errs()
                    << "No slicing criteria specified (-sc or -c option)\n";
            std::exit(1);
        }
    }

    /// Fill the structure
    SlicerOptions options;

    options.inputFile = inputFile;
    options.outputFile = outputFile;
    options.slicingCriteria = slicingCriteria;
    options.legacySlicingCriteria = legacySlicingCriteria;
    options.legacySecondarySlicingCriteria = legacySecondarySlicingCriteria;
    options.preservedFunctions = splitList(preservedFuns);
    options.removeSlicingCriteria = removeSlicingCriteria;
    options.forwardSlicing = forwardSlicing;
    options.cutoffDiverging = cutoffDiverging;
    options.criteriaAreNextInstr = criteriaAreNextInstr;

    auto &dgOptions = options.dgOptions;
    auto &PTAOptions = dgOptions.PTAOptions;
    auto &DDAOptions = dgOptions.DDAOptions;
    auto &CDAOptions = dgOptions.CDAOptions;

    dgOptions.entryFunction = entryFunction;
    dgOptions.preserveDbg = preserveDbg;
    dgOptions.threads = threads;

    CDAOptions.algorithm = cdAlgorithm;
    CDAOptions.interprocedural = interprocCd;
    CDAOptions._icfg = icfgCD;
    CDAOptions.setNodePerInstruction(cdaPerInstr);

    addAllocationFuns(dgOptions, allocationFuns);

    PTAOptions.entryFunction = entryFunction;
    PTAOptions.fieldSensitivity = dg::Offset(ptaFieldSensitivity);
    PTAOptions.analysisType = ptaType;
    PTAOptions.threads = threads;

    DDAOptions.threads = threads;
    DDAOptions.entryFunction = entryFunction;
    DDAOptions.undefinedFunsBehavior = undefinedFunsBehavior;
    DDAOptions.analysisType = ddaType;

    return options;
}